

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Off_reader.h
# Opt level: O2

bool __thiscall Gudhi::Off_reader::goto_next_uncomment_line(Off_reader *this,string *uncomment_line)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  do {
    std::istream::sentry::sentry((sentry *)((long)&uStack_28 + 7),(istream *)this->stream_,false);
    if (uStack_28._7_1_ != '\x01') {
      return false;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)this->stream_,(string *)uncomment_line);
  } while (*(uncomment_line->_M_dataplus)._M_p == '#');
  return ((byte)this->stream_[*(long *)(*(long *)this->stream_ + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool goto_next_uncomment_line(std::string& uncomment_line) {
    do {
      // skip whitespace, including empty lines
      if (!std::ifstream::sentry(stream_)) return false;
      std::getline(stream_, uncomment_line);
    } while (uncomment_line[0] == '#');
    return static_cast<bool>(stream_);
  }